

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

QString * __thiscall
DebugDirCVEntryWrapper::getSignature(QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_28;
  
  iVar4 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QString::asprintf((char *)&local_28,"%.4s",CONCAT44(extraout_var,iVar4));
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_28.d;
    (__return_storage_ptr__->d).ptr = local_28.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_28.size;
    local_28.d = pDVar2;
    local_28.ptr = pcVar3;
    local_28.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getSignature()
{
    DEBUG_RSDSI* rdsi = (DEBUG_RSDSI*)this->getPtr();
    if (!rdsi) return "";

    QString out;
#if QT_VERSION >= 0x050000
    out = QString().asprintf("%.4s", (char*)&rdsi->dwSig);
#else
    out = QString().sprintf("%.4s", (char*)&rdsi->dwSig);
#endif
    return out;
}